

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

void __thiscall
ArbitraryArbitrary_Arithmetic_IntCast::ArbitraryArbitrary_Arithmetic_IntCast
          (ArbitraryArbitrary_Arithmetic_IntCast *this)

{
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  ArbitraryArbitrary_Arithmetic_IntCast *local_10;
  ArbitraryArbitrary_Arithmetic_IntCast *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Arbitrary_Arithmetic_IntCast",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Arbitrary",&local_69);
  testinator::Test::Test(&this->super_Test,(string *)local_30,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ArbitraryArbitrary_Arithmetic_IntCast_002c3320
  ;
  return;
}

Assistant:

DEF_TEST(Arbitrary_Arithmetic_IntCast, Arbitrary)
{
  testinator::Arbitrary<signed char> a;
  signed char v = a.generate(0,0);
  v = a.generate(1,0);
  v = a.generate(2,0);
  v = a.generate(3,0);
  a.shrink(v);
  return true;
}